

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O0

void TiXmlBase::ConvertUTF32ToUTF8(unsigned_long input,char *output,int *length)

{
  undefined8 local_68;
  unsigned_long FIRST_BYTE_MARK [7];
  unsigned_long BYTE_MARK;
  unsigned_long BYTE_MASK;
  int *length_local;
  char *output_local;
  unsigned_long input_local;
  
  FIRST_BYTE_MARK[6] = 0x80;
  memset(&local_68,0,0x38);
  FIRST_BYTE_MARK[1] = 0xc0;
  FIRST_BYTE_MARK[2] = 0xe0;
  FIRST_BYTE_MARK[3] = 0xf0;
  FIRST_BYTE_MARK[4] = 0xf8;
  FIRST_BYTE_MARK[5] = 0xfc;
  if (input < 0x80) {
    *length = 1;
  }
  else if (input < 0x800) {
    *length = 2;
  }
  else if (input < 0x10000) {
    *length = 3;
  }
  else {
    if (0x1fffff < input) {
      *length = 0;
      return;
    }
    *length = 4;
  }
  length_local = (int *)(output + *length);
  output_local = (char *)input;
  switch(*length) {
  case 4:
    length_local = (int *)((long)length_local + -1);
    *(byte *)length_local = (byte)input & 0xbf | 0x80;
    output_local = (char *)(input >> 6);
  case 3:
    length_local = (int *)((long)length_local + -1);
    *(byte *)length_local = (byte)output_local & 0xbf | 0x80;
    output_local = (char *)((ulong)output_local >> 6);
  case 2:
    length_local = (int *)((long)length_local + -1);
    *(byte *)length_local = (byte)output_local & 0xbf | 0x80;
    output_local = (char *)((ulong)output_local >> 6);
  case 1:
    *(byte *)((long)length_local + -1) =
         (byte)output_local | (byte)FIRST_BYTE_MARK[(long)*length + -1];
    return;
  default:
    return;
  }
}

Assistant:

void TiXmlBase::ConvertUTF32ToUTF8( unsigned long input, char* output, int* length )
{
	const unsigned long BYTE_MASK = 0xBF;
	const unsigned long BYTE_MARK = 0x80;
	const unsigned long FIRST_BYTE_MARK[7] = { 0x00, 0x00, 0xC0, 0xE0, 0xF0, 0xF8, 0xFC };

	if (input < 0x80) 
		*length = 1;
	else if ( input < 0x800 )
		*length = 2;
	else if ( input < 0x10000 )
		*length = 3;
	else if ( input < 0x200000 )
		*length = 4;
	else
		{ *length = 0; return; }	// This code won't covert this correctly anyway.

	output += *length;

	// Scary scary fall throughs.
	switch (*length) 
	{
		case 4:
			--output; 
			*output = (char)((input | BYTE_MARK) & BYTE_MASK); 
			input >>= 6;
		case 3:
			--output; 
			*output = (char)((input | BYTE_MARK) & BYTE_MASK); 
			input >>= 6;
		case 2:
			--output; 
			*output = (char)((input | BYTE_MARK) & BYTE_MASK); 
			input >>= 6;
		case 1:
			--output; 
			*output = (char)(input | FIRST_BYTE_MARK[*length]);
	}
}